

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O0

void obuf_reset(obuf *buf)

{
  int iVar1;
  int local_18;
  int i;
  int iovcnt;
  obuf *buf_local;
  
  iVar1 = obuf_iovcnt(buf);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    buf->iov[local_18].iov_len = 0;
  }
  buf->pos = 0;
  buf->used = 0;
  buf->reserved = false;
  return;
}

Assistant:

void
obuf_reset(struct obuf *buf)
{
	int iovcnt = obuf_iovcnt(buf);
	int i;
	for (i = 0; i < iovcnt; i++)
		buf->iov[i].iov_len = 0;
	buf->pos = 0;
	buf->used = 0;
#ifndef NDEBUG
	buf->reserved = false;
#endif
}